

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

void __thiscall google::protobuf::UnknownFieldSet::ClearAndFreeMemory(UnknownFieldSet *this)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *this_00;
  UnknownFieldSet *this_local;
  
  if (this->fields_ !=
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    Clear(this);
    this_00 = this->fields_;
    if (this_00 !=
        (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
        0x0) {
      std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
      ~vector(this_00);
      operator_delete(this_00,0x18);
    }
    this->fields_ =
         (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
         0x0;
  }
  return;
}

Assistant:

void UnknownFieldSet::ClearAndFreeMemory() {
  if (fields_ != NULL) {
    Clear();
    delete fields_;
    fields_ = NULL;
  }
}